

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSqueezeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  _Rb_tree_header *this_00;
  uint uVar1;
  uint32 uVar2;
  bool bVar3;
  SqueezeLayerParams *pSVar4;
  int64 iVar5;
  iterator iVar6;
  Type *pTVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  int iVar9;
  int index;
  int a;
  undefined4 uStack_104;
  int *piStack_100;
  pointer local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  int local_8c;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  Result r;
  
  Result::Result(&r);
  validateInputCount((Result *)&axes_set,layer,1,1);
  Result::operator=(&r,(Result *)&axes_set);
  this_00 = &axes_set._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::~string((string *)this_00);
  bVar3 = Result::good(&r);
  if (bVar3) {
    validateOutputCount((Result *)&axes_set,layer,1,1);
    Result::operator=(&r,(Result *)&axes_set);
    std::__cxx11::string::~string((string *)&axes_set._M_t._M_impl.super__Rb_tree_header);
  }
  pSVar4 = Specification::NeuralNetworkLayer::squeeze(layer);
  if (pSVar4->squeezeall_ == false) {
    pSVar4 = Specification::NeuralNetworkLayer::squeeze(layer);
    if ((pSVar4->axes_).current_size_ == 0) {
      std::__cxx11::string::string((string *)&local_f0,(string *)(layer->name_).ptr_);
      std::operator+(&err_1,"Squeeze Layer \'",&local_f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&axes_set,
                     &err_1,"\': length of the \'axes\' parameter cannot be 0.");
      std::__cxx11::string::~string((string *)&err_1);
      std::__cxx11::string::~string((string *)&local_f0);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&axes_set);
      std::__cxx11::string::~string((string *)&axes_set);
      goto LAB_002559cb;
    }
    axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar9 = 0;
    axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &this_00->_M_header;
    axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &this_00->_M_header;
    while( true ) {
      pSVar4 = Specification::NeuralNetworkLayer::squeeze(layer);
      if ((pSVar4->axes_).current_size_ <= iVar9) break;
      pSVar4 = Specification::NeuralNetworkLayer::squeeze(layer);
      iVar5 = Specification::SqueezeLayerParams::axes(pSVar4,iVar9);
      _a = (pointer)CONCAT44(uStack_104,(int)iVar5);
      iVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &axes_set,&a);
      if ((_Rb_tree_header *)iVar6._M_node != this_00) {
        std::__cxx11::string::string((string *)&local_b0,(string *)(layer->name_).ptr_);
        std::operator+(&local_f0,"Squeeze Layer \'",&local_b0);
        std::operator+(&err_1,&local_f0,
                       "\': all the values in the \'axes\' parameter must be unique.");
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_b0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
        goto LAB_002559b4;
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &axes_set,&a);
      iVar9 = iVar9 + 1;
    }
    if ((0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) &&
       (0 < (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_)) {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                         (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
      uVar1 = pTVar7->rank_;
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                         (&(layer->outputtensor_).super_RepeatedPtrFieldBase,0);
      uVar2 = pTVar7->rank_;
      pSVar4 = Specification::NeuralNetworkLayer::squeeze(layer);
      iVar9 = (pSVar4->axes_).current_size_;
      if ((uVar1 == 1) || (uVar2 + iVar9 == uVar1)) {
        _a = (pointer)0x0;
        piStack_100 = (int *)0x0;
        local_f8 = (pointer)0x0;
        index = 0;
        if (iVar9 < 1) {
          iVar9 = index;
        }
        for (; iVar9 != index; index = index + 1) {
          pSVar4 = Specification::NeuralNetworkLayer::squeeze(layer);
          iVar5 = Specification::SqueezeLayerParams::axes(pSVar4,index);
          local_8c = ((int)iVar5 >> 0x1f & uVar1) + (int)iVar5;
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            (_a,piStack_100,&local_8c);
          if (_Var8._M_current != piStack_100) {
            std::__cxx11::string::string((string *)&local_b0,(string *)(layer->name_).ptr_);
            std::operator+(&local_f0,"Squeeze Layer \'",&local_b0);
            std::operator+(&err_1,&local_f0,
                           "\': axes parameter list cannot have the same value more than once.");
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_b0);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
            goto LAB_00255b55;
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&a,&local_8c);
        }
        _Var8 = std::
                __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (_a,piStack_100);
        iVar9 = *_Var8._M_current;
        _Var8 = std::
                __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (_a,piStack_100);
        if ((iVar9 < (int)uVar1) && (-1 < *_Var8._M_current)) {
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&a);
          goto LAB_00255a85;
        }
        std::__cxx11::string::string((string *)&local_b0,(string *)(layer->name_).ptr_);
        std::operator+(&local_f0,"Squeeze Layer \'",&local_b0);
        std::operator+(&err_1,&local_f0,
                       "\': axes refers to a dimension that exceeds the input rank.");
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_b0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
LAB_00255b55:
        std::__cxx11::string::~string((string *)&err_1);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&a);
      }
      else {
        std::__cxx11::string::string((string *)&local_b0,(string *)(layer->name_).ptr_);
        std::operator+(&local_f0,"Squeeze Layer \'",&local_b0);
        std::operator+(&err_1,&local_f0,
                       "\': output rank plus the length of the axes parameter must equal input rank."
                      );
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_b0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
LAB_002559b4:
        std::__cxx11::string::~string((string *)&err_1);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&axes_set._M_t);
      goto LAB_002559cb;
    }
LAB_00255a85:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&axes_set._M_t);
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_002559cb:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSqueezeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!layer.squeeze().squeezeall()) {

        if (layer.squeeze().axes_size() == 0) {
            std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        // either all values in axes must be positive or all negative
        std::set<int> axes_set;
        for (int i=0; i<layer.squeeze().axes_size(); i++) {
            int a = (int)layer.squeeze().axes(i);
            if (axes_set.find(a) != axes_set.end()) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            } else {
                axes_set.insert(a);
            }
        }

        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            int input_rank = static_cast<int>(layer.inputtensor(0).rank());
            int output_rank = static_cast<int>(layer.outputtensor(0).rank());
            int axes_length = layer.squeeze().axes_size();

            if (input_rank != 1) {
                if (output_rank + axes_length != input_rank) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': output rank plus the length of the axes parameter must equal input rank.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }

            std::vector<int> axes;
            for (int i=0; i<axes_length; i++) {
                int a = (int)layer.squeeze().axes(i);
                if (a < 0) {
                    a = input_rank + a;
                }
                if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                axes.push_back(a);
            }

            int max_value = *std::max_element(axes.begin(), axes.end());
            int min_value = *std::min_element(axes.begin(), axes.end());
            if (max_value > input_rank - 1 || min_value < 0) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the input rank.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return r;
}